

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker
          (DateTimePicker *this,QVariant *val,Type parserType,QWidget *parent)

{
  int iVar1;
  DateTimePickerPrivate *pDVar2;
  ConnectionType type;
  undefined1 local_d0 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_c0;
  code *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_98;
  code *local_90;
  undefined8 local_88;
  undefined1 local_80 [12];
  QTime local_74;
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  local_70;
  QDateTime local_68 [8];
  QDateTime local_60 [12];
  QTime local_54;
  QDate local_50;
  QMetaType local_48;
  QSizePolicy local_40 [5];
  QFlags<Qt::WindowType> local_2c;
  QWidget *local_28;
  QWidget *parent_local;
  QVariant *pQStack_18;
  Type parserType_local;
  QVariant *val_local;
  DateTimePicker *this_local;
  
  local_28 = parent;
  parent_local._4_4_ = parserType;
  pQStack_18 = val;
  val_local = (QVariant *)this;
  QFlags<Qt::WindowType>::QFlags(&local_2c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_2c.i);
  *(undefined ***)this = &PTR_metaObject_00232568;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_00232718;
  pDVar2 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(pDVar2,this,parent_local._4_4_);
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::QScopedPointer(&this->d,pDVar2);
  QSizePolicy::QSizePolicy(local_40,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  local_48.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
  iVar1 = QMetaType::id(&local_48,0);
  if (iVar1 == 0xe) {
    local_50.jd = QVariant::toDate();
    setDate(this,&local_50);
  }
  else if (iVar1 == 0xf) {
    local_54.mds = QVariant::toTime();
    setTime(this,&local_54);
  }
  else if (iVar1 == 0x10) {
    QVariant::toDateTime();
    setDateTime(this,local_60);
    QDateTime::~QDateTime(local_60);
  }
  else {
    QDate::QDate((QDate *)&local_70,2000,1,1);
    QTime::QTime(&local_74,0,0,0,0);
    QDateTime::QDateTime
              (local_68,(QDate *)local_70.d,(QTime *)(ulong)(uint)local_74.mds,LocalTime,0);
    setDateTime(this,local_68);
    QDateTime::~QDateTime(local_68);
  }
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_90 = Scroller::aboutToStart;
  local_88 = 0;
  local_a8._8_8_ = _q_scrollAboutToStart;
  QStack_98.d = (ScrollerPrivate *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_80,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_b8 = Scroller::scroll;
  local_b0 = 0;
  local_d0._8_8_ = _q_scroll;
  QStack_c0.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_a8,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_d0,(offset_in_Scroller_to_subr)pDVar2->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QVariant & val, QMetaType::Type parserType,
	QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, parserType ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	switch( val.metaType().id() )
	{
		case QMetaType::QDate :
			setDate( val.toDate() );
			break;

		case QMetaType::QTime :
			setTime( val.toTime() );
			break;

		case QMetaType::QDateTime :
			setDateTime( val.toDateTime() );
			break;

		default :
			setDateTime( QDateTime( DATETIMEPICKER_DATE_INITIAL,
				DATETIMEPICKER_TIME_MIN ) );
	}

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}